

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void touch_file(char *name)

{
  char *__s;
  size_t sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  uv_fs_event_t *puVar9;
  uv_fs_event_t *puVar10;
  size_t sVar11;
  int extraout_EDX;
  ulong unaff_RBX;
  long lVar12;
  code *__s1;
  undefined1 *unaff_R14;
  uv_fs_t req;
  size_t sStack_848;
  char acStack_840 [1032];
  uv_fs_event_t *puStack_438;
  uv_fs_event_t uStack_3f8;
  uv_fs_event_t uStack_370;
  undefined8 uStack_2e8;
  code *pcStack_2e0;
  code *pcStack_2d8;
  code *pcStack_2d0;
  code *pcStack_2c8;
  undefined1 *puStack_2b8;
  code *pcStack_2b0;
  undefined1 auStack_2a0 [152];
  code *pcStack_208;
  ulong uStack_1f8;
  code *pcStack_1f0;
  undefined8 local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [440];
  
  iVar4 = 2;
  pcStack_1f0 = (code *)0x15126e;
  uVar2 = uv_fs_open(0,local_1c8,name,2,0,0);
  if ((int)uVar2 < 0) {
    pcStack_1f0 = (code *)0x151300;
    touch_file_cold_1();
LAB_00151300:
    pcStack_1f0 = (code *)0x151305;
    touch_file_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    unaff_R14 = local_1c8;
    pcStack_1f0 = (code *)0x151285;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1f0 = (code *)0x151296;
    local_1d8 = uv_buf_init("foo",4);
    puVar8 = local_1d8;
    local_1e8 = 0;
    pcStack_1f0 = (code *)0x1512c3;
    iVar3 = uv_fs_write(0,unaff_R14,unaff_RBX,puVar8,1,0xffffffffffffffff);
    iVar4 = (int)puVar8;
    if (iVar3 < 0) goto LAB_00151300;
    unaff_R14 = local_1c8;
    pcStack_1f0 = (code *)0x1512d4;
    uv_fs_req_cleanup(unaff_R14);
    iVar4 = 0;
    pcStack_1f0 = (code *)0x1512e2;
    iVar3 = uv_fs_close(0,unaff_R14,uVar2);
    if (iVar3 == 0) {
      pcStack_1f0 = (code *)0x1512f0;
      uv_fs_req_cleanup(local_1c8);
      return;
    }
  }
  pcStack_1f0 = run_test_fs_event_no_callback_on_close;
  touch_file_cold_3();
  pcStack_208 = (code *)0x151313;
  uStack_1f8 = unaff_RBX;
  pcStack_1f0 = (code *)unaff_R14;
  uVar5 = uv_default_loop();
  pcStack_208 = (code *)0x151325;
  remove("watch_dir/file1");
  pcStack_208 = (code *)0x151331;
  remove("watch_dir/");
  pcStack_208 = (code *)0x15133d;
  create_dir("watch_dir");
  pcStack_208 = (code *)0x151345;
  create_file("watch_dir/file1");
  pcStack_208 = (code *)0x151354;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_208 = (code *)0x151378;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1");
    if (iVar3 != 0) goto LAB_0015140a;
    pcStack_208 = (code *)0x151393;
    uv_close(&fs_event,close_cb);
    pcStack_208 = (code *)0x15139d;
    uv_run(uVar5,0);
    if (fs_event_cb_called != 0) goto LAB_0015140f;
    if (close_cb_called != 1) goto LAB_00151414;
    pcStack_208 = (code *)0x1513bb;
    remove("watch_dir/file1");
    pcStack_208 = (code *)0x1513c7;
    remove("watch_dir/");
    pcStack_208 = (code *)0x1513cc;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x1513e0;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_208 = (code *)0x1513ea;
    uv_run(uVar5,0);
    pcStack_208 = (code *)0x1513ef;
    uVar6 = uv_default_loop();
    pcStack_208 = (code *)0x1513f7;
    iVar3 = uv_loop_close(uVar6);
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_208 = (code *)0x15140a;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_0015140a:
    pcStack_208 = (code *)0x15140f;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_0015140f:
    pcStack_208 = (code *)0x151414;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_00151414:
    pcStack_208 = (code *)0x151419;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  pcStack_208 = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_2b0 = (code *)0x15142b;
  pcStack_208 = (code *)uVar5;
  puVar7 = (undefined1 *)uv_default_loop();
  pcStack_2b0 = (code *)0x15143b;
  puVar8 = puVar7;
  iVar3 = uv_timer_init(puVar7,auStack_2a0);
  if (iVar3 == 0) {
    puVar8 = auStack_2a0;
    iVar4 = 0;
    pcStack_2b0 = (code *)0x151457;
    iVar3 = uv_timer_start(puVar8,timer_cb,1);
    if (iVar3 != 0) goto LAB_001514b2;
    pcStack_2b0 = (code *)0x151465;
    puVar8 = puVar7;
    uv_run(puVar7,0);
    if (close_cb_called != 2) goto LAB_001514b7;
    pcStack_2b0 = (code *)0x151473;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_2b0 = (code *)0x151487;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_2b0 = (code *)0x151491;
    uv_run(puVar7,0);
    pcStack_2b0 = (code *)0x151496;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_2b0 = (code *)0x15149e;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_2b0 = (code *)0x1514b2;
    run_test_fs_event_immediate_close_cold_1();
LAB_001514b2:
    pcStack_2b0 = (code *)0x1514b7;
    run_test_fs_event_immediate_close_cold_2();
LAB_001514b7:
    pcStack_2b0 = (code *)0x1514bc;
    run_test_fs_event_immediate_close_cold_3();
  }
  pcStack_2b0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_2b0 = (code *)0x182f2e;
  pcStack_2c8 = (code *)0x1514d8;
  puStack_2b8 = puVar7;
  iVar3 = uv_fs_event_init(*(undefined8 *)(puVar8 + 8),&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2c8 = (code *)0x1514f8;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    if (iVar3 == 0) {
      pcStack_2c8 = (code *)0x151512;
      uv_close(&fs_event,close_cb);
      uv_close(puVar8,close_cb);
      return;
    }
  }
  else {
    pcStack_2c8 = (code *)0x151529;
    timer_cb_cold_1();
  }
  pcStack_2c8 = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStack_2d0 = (code *)0x151534;
  pcStack_2c8 = (code *)puVar8;
  uVar5 = uv_default_loop();
  pcStack_2d0 = (code *)0x151543;
  create_dir("watch_dir");
  pcStack_2d0 = (code *)0x15154f;
  create_file("watch_dir/file");
  pcStack_2d0 = (code *)0x15155e;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2d0 = (code *)0x151582;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    if (iVar3 != 0) goto LAB_00151611;
    pcStack_2d0 = (code *)0x151596;
    touch_file("watch_dir/file");
    pcStack_2d0 = (code *)0x1515a9;
    uv_close(&fs_event,close_cb);
    pcStack_2d0 = (code *)0x1515b3;
    uv_run(uVar5,0);
    if (close_cb_called != 1) goto LAB_00151616;
    pcStack_2d0 = (code *)0x1515c8;
    remove("watch_dir/file");
    pcStack_2d0 = (code *)0x1515d4;
    remove("watch_dir/");
    pcStack_2d0 = (code *)0x1515d9;
    uVar5 = uv_default_loop();
    pcStack_2d0 = (code *)0x1515ed;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_2d0 = (code *)0x1515f7;
    uv_run(uVar5,0);
    pcStack_2d0 = (code *)0x1515fc;
    uv_default_loop();
    pcStack_2d0 = (code *)0x151604;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_2d0 = (code *)0x151611;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_00151611:
    pcStack_2d0 = (code *)0x151616;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00151616:
    pcStack_2d0 = (code *)0x15161b;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStack_2d0 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStack_2d8 = (code *)0x151626;
  pcStack_2d0 = (code *)uVar5;
  uVar5 = uv_default_loop();
  pcStack_2d8 = (code *)0x151630;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_2d8 = (code *)0x15163c;
  create_dir("watch_dir");
  pcStack_2d8 = (code *)0x15164b;
  iVar3 = uv_fs_event_init(uVar5,&fs_event);
  if (iVar3 == 0) {
    iVar4 = 0;
    pcStack_2d8 = (code *)0x15166f;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    if (iVar3 != 0) goto LAB_0015173c;
    pcStack_2d8 = (code *)0x151686;
    iVar3 = uv_timer_init(uVar5,&timer);
    if (iVar3 != 0) goto LAB_00151741;
    iVar4 = 0;
    pcStack_2d8 = (code *)0x1516a8;
    iVar3 = uv_timer_start(&timer,fs_event_create_files,100);
    if (iVar3 != 0) goto LAB_00151746;
    pcStack_2d8 = (code *)0x1516ba;
    uv_run(uVar5,0);
    pcStack_2d8 = (code *)0x1516cd;
    uv_close(&timer,close_cb);
    pcStack_2d8 = (code *)0x1516da;
    uv_run(uVar5,1);
    if (close_cb_called != 2) goto LAB_0015174b;
    if (fs_event_cb_called != 3) goto LAB_00151750;
    pcStack_2d8 = (code *)0x1516f3;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_2d8 = (code *)0x1516ff;
    remove("watch_dir/");
    pcStack_2d8 = (code *)0x151704;
    uVar5 = uv_default_loop();
    pcStack_2d8 = (code *)0x151718;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_2d8 = (code *)0x151722;
    uv_run(uVar5,0);
    pcStack_2d8 = (code *)0x151727;
    uVar6 = uv_default_loop();
    pcStack_2d8 = (code *)0x15172f;
    iVar3 = uv_loop_close(uVar6);
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_2d8 = (code *)0x15173c;
    run_test_fs_event_close_in_callback_cold_1();
LAB_0015173c:
    pcStack_2d8 = (code *)0x151741;
    run_test_fs_event_close_in_callback_cold_2();
LAB_00151741:
    pcStack_2d8 = (code *)0x151746;
    run_test_fs_event_close_in_callback_cold_3();
LAB_00151746:
    pcStack_2d8 = (code *)0x15174b;
    run_test_fs_event_close_in_callback_cold_4();
LAB_0015174b:
    pcStack_2d8 = (code *)0x151750;
    run_test_fs_event_close_in_callback_cold_5();
LAB_00151750:
    pcStack_2d8 = (code *)0x151755;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStack_2d8 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  if (iVar4 == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close();
        return;
      }
      return;
    }
  }
  else {
    pcStack_2e0 = (code *)0x15178b;
    fs_event_cb_close_cold_1();
  }
  pcStack_2e0 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_2e0 = (code *)0x182f2e;
  uStack_2e8 = uVar5;
  puVar9 = (uv_fs_event_t *)uv_default_loop();
  create_dir("watch_dir");
  __s1 = (code *)&uStack_370;
  puVar10 = puVar9;
  iVar3 = uv_fs_event_init();
  if (iVar3 == 0) {
    __s1 = fs_event_cb_dir;
    puVar10 = &uStack_370;
    iVar4 = 0;
    iVar3 = uv_fs_event_start(puVar10,fs_event_cb_dir,"watch_dir");
    if (iVar3 != 0) goto LAB_001518ab;
    __s1 = (code *)&uStack_3f8;
    puVar10 = puVar9;
    iVar3 = uv_fs_event_init();
    if (iVar3 != 0) goto LAB_001518b0;
    __s1 = fs_event_cb_dir;
    puVar10 = &uStack_3f8;
    iVar4 = 0;
    iVar3 = uv_fs_event_start(puVar10,fs_event_cb_dir,"watch_dir");
    if (iVar3 != 0) goto LAB_001518b5;
    uv_close(&uStack_3f8,close_cb);
    uv_close(&uStack_370);
    __s1 = (code *)0x0;
    puVar10 = puVar9;
    uv_run();
    if (close_cb_called != 2) goto LAB_001518ba;
    remove("watch_dir/");
    puVar9 = (uv_fs_event_t *)uv_default_loop();
    uv_walk(puVar9,close_walk_cb,0);
    __s1 = (code *)0x0;
    uv_run(puVar9);
    puVar10 = (uv_fs_event_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_001518ab:
    run_test_fs_event_start_and_close_cold_2();
LAB_001518b0:
    run_test_fs_event_start_and_close_cold_3();
LAB_001518b5:
    run_test_fs_event_start_and_close_cold_4();
LAB_001518ba:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar10 == &fs_event) {
    if (iVar4 != 0) goto LAB_0015191f;
    if (extraout_EDX != 2) goto LAB_00151924;
    iVar4 = strcmp((char *)__s1,"file1");
    if (iVar4 != 0) goto LAB_00151929;
    iVar4 = uv_fs_event_stop(&fs_event);
    if (iVar4 == 0) {
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0015191f:
    fs_event_cb_dir_cold_2();
LAB_00151924:
    fs_event_cb_dir_cold_3();
LAB_00151929:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_438 = puVar9;
  uVar5 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar12 = 0;
  do {
    iVar4 = uv_fs_event_init(uVar5,&fs_event);
    if (iVar4 != 0) {
LAB_00151b28:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00151b2d;
    }
    sStack_848 = 0x400;
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    if (iVar4 != -0x16) {
LAB_00151b23:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00151b28;
    }
    __s = *(char **)((long)&DAT_001c8ca0 + lVar12);
    iVar4 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar4 != 0) {
LAB_00151b1e:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00151b23;
    }
    sStack_848 = 0;
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    sVar1 = sStack_848;
    if (iVar4 != -0x69) {
LAB_00151b19:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00151b1e;
    }
    if (0x3ff < sStack_848) {
LAB_00151b14:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00151b19;
    }
    sVar11 = strlen(__s);
    if (sVar1 != sVar11 + 1) {
LAB_00151b0f:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00151b14;
    }
    iVar4 = uv_fs_event_getpath(&fs_event,acStack_840,&sStack_848);
    sVar1 = sStack_848;
    if (iVar4 != 0) {
LAB_00151b0a:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00151b0f;
    }
    sVar11 = strlen(__s);
    if (sVar1 != sVar11) {
LAB_00151b05:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00151b0a;
    }
    iVar4 = strcmp(acStack_840,__s);
    if (iVar4 != 0) {
LAB_00151b00:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00151b05;
    }
    iVar4 = uv_fs_event_stop(&fs_event);
    if (iVar4 != 0) {
LAB_00151afb:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00151b00;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar5,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00151afb;
    }
    close_cb_called = 0;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x28);
  remove("watch_dir/");
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar4 = uv_loop_close(uVar5);
  if (iVar4 == 0) {
    return;
  }
LAB_00151b2d:
  run_test_fs_event_getpath_cold_12();
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar4 = uv_loop_close(uVar5);
  if (iVar4 == 0) {
    return;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar10 = (uv_fs_event_t *)uv_default_loop();
  iVar4 = uv_fs_event_init(puVar10,&fs_event);
  if (iVar4 == 0) {
    puVar10 = &fs_event;
    iVar4 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar4 == 0) goto LAB_00151c2a;
    puVar10 = &fs_event;
    iVar4 = uv_is_active(&fs_event);
    if (iVar4 != 0) goto LAB_00151c2f;
    puVar10 = &fs_event;
    iVar4 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar4 == 0) goto LAB_00151c34;
    puVar10 = &fs_event;
    iVar4 = uv_is_active(&fs_event);
    if (iVar4 == 0) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      puVar10 = (uv_fs_event_t *)uv_default_loop();
      iVar4 = uv_loop_close(puVar10);
      if (iVar4 == 0) {
        return;
      }
      goto LAB_00151c3e;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151c2a:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151c2f:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151c34:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151c3e:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return;
  }
  uv_close(puVar10,0);
  return;
}

Assistant:

static void touch_file(const char* name) {
  int r;
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;

  r = uv_fs_open(NULL, &req, name, O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  file = r;
  uv_fs_req_cleanup(&req);

  buf = uv_buf_init("foo", 4);
  r = uv_fs_write(NULL, &req, file, &buf, 1, -1, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
}